

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginDataSegment
          (BinaryReaderIR *this,Index index,Index memory_index,uint8_t flags)

{
  Module *this_00;
  pointer pDVar1;
  unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  local_c8;
  Location local_c0;
  Var local_a0;
  DataSegment *local_58;
  DataSegment *data_segment;
  undefined1 local_30 [8];
  __single_object field;
  uint8_t flags_local;
  Index memory_index_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ._M_t.
  super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
  .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl._7_1_ = flags;
  GetLocation((Location *)&data_segment,this);
  std::make_unique<wabt::DataSegmentModuleField,wabt::Location>((Location *)local_30);
  pDVar1 = std::
           unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
           ::operator->((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                         *)local_30);
  local_58 = &pDVar1->data_segment;
  GetLocation(&local_c0,this);
  Var::Var(&local_a0,memory_index,&local_c0);
  Var::operator=(&local_58->memory_var,&local_a0);
  Var::~Var(&local_a0);
  if ((field._M_t.
       super___uniq_ptr_impl<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
       ._M_t.
       super__Tuple_impl<0UL,_wabt::DataSegmentModuleField_*,_std::default_delete<wabt::DataSegmentModuleField>_>
       .super__Head_base<0UL,_wabt::DataSegmentModuleField_*,_false>._M_head_impl._7_1_ & 1) == 1) {
    local_58->kind = Passive;
  }
  else {
    local_58->kind = Active;
  }
  this_00 = this->module_;
  std::unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ::unique_ptr(&local_c8,
               (unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                *)local_30);
  Module::AppendField(this_00,&local_c8);
  std::unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ::~unique_ptr(&local_c8);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
  ::~unique_ptr((unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                 *)local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::BeginDataSegment(Index index,
                                        Index memory_index,
                                        uint8_t flags) {
  auto field = std::make_unique<DataSegmentModuleField>(GetLocation());
  DataSegment& data_segment = field->data_segment;
  data_segment.memory_var = Var(memory_index, GetLocation());
  if ((flags & SegPassive) == SegPassive) {
    data_segment.kind = SegmentKind::Passive;
  } else {
    data_segment.kind = SegmentKind::Active;
  }
  module_->AppendField(std::move(field));
  return Result::Ok;
}